

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var __thiscall
Js::TypedArray<unsigned_char,_false,_true>::DirectGetItem
          (TypedArray<unsigned_char,_false,_true> *this,uint32 index)

{
  uint uVar1;
  ArrayBufferBase *pAVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  
  pAVar2 = (this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr;
  if (pAVar2->isDetached == true) {
    JavascriptError::ThrowTypeError
              ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  if (index < (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length) {
    uVar1 = (this->super_TypedArrayBase).byteOffset;
    uVar5 = (*(pAVar2->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar5 < (ulong)index + (ulong)uVar1 + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x129,
                                  "((index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pRVar7 = (RecyclableObject *)
             ((ulong)(this->super_TypedArrayBase).buffer[index] | 0x1000000000000);
  }
  else {
    pRVar7 = (((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  return pRVar7;
}

Assistant:

inline Var Uint8VirtualArray::DirectGetItem(__in uint32 index)
    {
        return BaseTypedDirectGetItem(index);
    }